

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBin
          (BamStandardIndex *this,uint32_t *binId,BaiAlignmentChunkVector *chunks)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *this_00;
  uint32_t binKey;
  uint local_6c;
  string local_68;
  string local_48;
  
  local_6c = *binId;
  if (this->m_isBigEndian == true) {
    local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
               local_6c << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var,iVar2) == 4) {
    WriteAlignmentChunks(this,chunks);
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamStandardIndex::WriteBin","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"could not write bin ID","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteBin(const uint32_t& binId, BaiAlignmentChunkVector& chunks)
{

    // write BAM bin ID
    uint32_t binKey = binId;
    if (m_isBigEndian) SwapEndian_32(binKey);
    const int64_t numBytesWritten = m_resources.Device->Write((const char*)&binKey, sizeof(binKey));
    if (numBytesWritten != sizeof(binKey))
        throw BamException("BamStandardIndex::WriteBin", "could not write bin ID");

    // write bin's alignment chunks
    WriteAlignmentChunks(chunks);
}